

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O0

BeliefLowerBound * __thiscall
despot::BaseRockSample::CreateBeliefLowerBound(BaseRockSample *this,string *name)

{
  bool bVar1;
  ostream *poVar2;
  string *name_local;
  BaseRockSample *this_local;
  
  bVar1 = std::operator==(name,"TRIVIAL");
  if (bVar1) {
    this_local = (BaseRockSample *)operator_new(0x10);
    despot::TrivialBeliefLowerBound::TrivialBeliefLowerBound
              ((TrivialBeliefLowerBound *)this_local,(DSPOMDP *)&this->super_BeliefMDP);
  }
  else {
    bVar1 = std::operator==(name,"DEFAULT");
    if (!bVar1) {
      bVar1 = std::operator==(name,"EAST");
      if (!bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Unsupported belief lower bound: ");
        poVar2 = std::operator<<(poVar2,(string *)name);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        exit(0);
      }
    }
    this_local = (BaseRockSample *)operator_new(0x18);
    RockSampleEastBeliefPolicy::RockSampleEastBeliefPolicy
              ((RockSampleEastBeliefPolicy *)this_local,(DSPOMDP *)&this->super_BeliefMDP);
  }
  return (BeliefLowerBound *)this_local;
}

Assistant:

BeliefLowerBound* BaseRockSample::CreateBeliefLowerBound(string name) const {
	if (name == "TRIVIAL") {
		return new TrivialBeliefLowerBound(this);
	} else if (name == "DEFAULT" || name == "EAST") {
		return new RockSampleEastBeliefPolicy(this);
	} else {
		cerr << "Unsupported belief lower bound: " << name << endl;
		exit(0);
		return NULL;
	}
}